

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_allocator.hpp
# Opt level: O2

JsonPartialValue * __thiscall
MercuryJson::BlockAllocator<MercuryJson::JsonValue>::
construct<MercuryJson::shift_reduce_impl::JsonPartialValue>
          (BlockAllocator<MercuryJson::JsonValue> *this)

{
  JsonPartialValue *pJVar1;
  
  check_alloc(this,0x10);
  pJVar1 = (JsonPartialValue *)this->ptr;
  pJVar1->type = TYPE_NULL;
  this->ptr = (char *)(pJVar1 + 1);
  this->allocated = this->allocated + 0x10;
  return pJVar1;
}

Assistant:

T *construct(Args ...args) {
            check_alloc(sizeof(T));
            static constexpr size_t size = round_up(sizeof(T), kAlignment);
            T *ret = new(ptr) T(std::forward<Args>(args)...);
            ptr += size;
            allocated += size;
            return ret;
        }